

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsFreewheel.cpp
# Opt level: O3

void __thiscall chrono::ChShaftsFreewheel::ChShaftsFreewheel(ChShaftsFreewheel *this)

{
  ChConstraintTwoGenericBoxed *pCVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [64];
  
  ChObj::ChObj((ChObj *)this);
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])
   ((long)&(this->super_ChShaftsCouple).super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = auVar2;
  (this->super_ChShaftsCouple).super_ChPhysicsItem.system = (ChSystem *)auVar2._0_8_;
  (this->super_ChShaftsCouple).super_ChPhysicsItem.vis_model_instance =
       (shared_ptr<chrono::ChVisualModelInstance>)auVar2._8_16_;
  (this->super_ChShaftsCouple).super_ChPhysicsItem.cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar2._24_8_;
  (this->super_ChShaftsCouple).shaft1 = (ChShaft *)0x0;
  (this->super_ChShaftsCouple).shaft2 = (ChShaft *)0x0;
  (this->super_ChShaftsCouple).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsFreewheel_00b252c0;
  this->step = 0.2617993877991494;
  pCVar1 = &this->constraint;
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  (pCVar1->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.c_i =
       (double)auVar2._0_8_;
  (pCVar1->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.l_i =
       (double)auVar2._8_8_;
  (pCVar1->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.b_i =
       (double)auVar2._16_8_;
  (pCVar1->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.cfm_i =
       (double)auVar2._24_8_;
  pCVar1 = &this->constraint;
  (pCVar1->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (pCVar1->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (pCVar1->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (pCVar1->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.broken = false;
  this->violation = 0.0;
  this->alpha_max = 0.0;
  auVar3 = ZEXT464(0) << 0x40;
  this->torque_react = 0.0;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.active =
       true;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.mode =
       CONSTRAINT_LOCK;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.g_i = 0.0
  ;
  *(undefined1 (*) [64])
   &(this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.variables_a = auVar3;
  (this->constraint).super_ChConstraintTwoGeneric.Cq_a = (ChRowVectorDynamic<double>)auVar3._0_16_;
  (this->constraint).super_ChConstraintTwoGeneric.Cq_b = (ChRowVectorDynamic<double>)auVar3._16_16_;
  (this->constraint).super_ChConstraintTwoGeneric.Eq_a = (ChVectorDynamic<double>)auVar3._32_16_;
  (this->constraint).super_ChConstraintTwoGeneric.Eq_b = (ChVectorDynamic<double>)auVar3._48_16_;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.
  _vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoGeneric_00b3af80;
  (this->constraint).l_min = -1.0;
  (this->constraint).l_max = 1.0;
  this->jamming_mode = false;
  this->phase = 0.0;
  this->free_forward = true;
  return;
}

Assistant:

ChShaftsFreewheel::ChShaftsFreewheel() : 
    step(CH_C_2PI/24.0), 
    torque_react(0), 
    jamming_mode(false), 
    phase(0), 
    violation(0), 
    alpha_max(0),
    free_forward(true) 
{}